

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_schemas.cpp
# Opt level: O0

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultSchemaGenerator::CreateDefaultEntry
          (DefaultSchemaGenerator *this,CatalogTransaction transaction,string *entry_name)

{
  bool bVar1;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> in_RDI;
  CreateSchemaInfo info;
  nullptr_t in_stack_fffffffffffffe68;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
  *in_stack_fffffffffffffe70;
  string *this_00;
  CreateSchemaInfo *in_stack_fffffffffffffe90;
  Catalog *in_stack_fffffffffffffe98;
  string local_160 [8];
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb8;
  CreateSchemaInfo *in_stack_fffffffffffffee0;
  string local_110 [34];
  undefined1 local_ee;
  
  bVar1 = IsDefaultSchema(in_stack_fffffffffffffea8);
  if (bVar1) {
    CreateSchemaInfo::CreateSchemaInfo(in_stack_fffffffffffffee0);
    StringUtil::Lower(in_stack_fffffffffffffeb8);
    this_00 = local_160;
    ::std::__cxx11::string::operator=(local_110,this_00);
    ::std::__cxx11::string::~string(this_00);
    local_ee = 1;
    make_uniq_base<duckdb::CatalogEntry,duckdb::DuckSchemaEntry,duckdb::Catalog&,duckdb::CreateSchemaInfo&>
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    CreateSchemaInfo::~CreateSchemaInfo((CreateSchemaInfo *)0x151b1aa);
  }
  else {
    unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>::
    unique_ptr<std::default_delete<duckdb::CatalogEntry>,void>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DefaultSchemaGenerator::CreateDefaultEntry(CatalogTransaction transaction,
                                                                    const string &entry_name) {
	if (IsDefaultSchema(entry_name)) {
		CreateSchemaInfo info;
		info.schema = StringUtil::Lower(entry_name);
		info.internal = true;
		return make_uniq_base<CatalogEntry, DuckSchemaEntry>(catalog, info);
	}
	return nullptr;
}